

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

Vec_Int_t * Saig_ManFindIsoPerm(Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  abctime aVar3;
  abctime aVar4;
  Iso_Man_t *p;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  
  aVar3 = Abc_Clock();
  aVar4 = Abc_Clock();
  p = Iso_ManCreate(pAig);
  aVar5 = Abc_Clock();
  p->timeFout = p->timeFout + (aVar5 - aVar3);
  Iso_ManPrintClasses(p,fVerbose,0);
  while( true ) {
    iVar1 = p->nClasses;
    aVar3 = Abc_Clock();
    if (iVar1 == 0) break;
    while( true ) {
      Iso_ManAssignAdjacency(p);
      aVar5 = Abc_Clock();
      p->timeFout = p->timeFout + (aVar5 - aVar3);
      aVar3 = Abc_Clock();
      Iso_ManRehashClassNodes(p);
      aVar5 = Abc_Clock();
      p->timeHash = p->timeHash + (aVar5 - aVar3);
      Iso_ManPrintClasses(p,fVerbose,0);
      if ((p->nSingles != 0) || (p->nClasses == 0)) break;
      Iso_ManBreakTies(p,fVerbose);
      aVar3 = Abc_Clock();
    }
  }
  p->timeTotal = aVar3 - aVar4;
  pAVar2 = p->pAig;
  if (p->nObjIds == pAVar2->nObjs[6] + pAVar2->nObjs[2] + pAVar2->nObjs[5] + 1) {
    pVVar6 = Iso_ManFinalize(p);
    Iso_ManStop(p,fVerbose);
    return pVVar6;
  }
  __assert_fail("p->nObjIds == 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigIsoSlow.c"
                ,0x4b9,"Vec_Int_t *Saig_ManFindIsoPerm(Aig_Man_t *, int)");
}

Assistant:

Vec_Int_t * Saig_ManFindIsoPerm( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Int_t * vRes;
    Iso_Man_t * p;
    abctime clk = Abc_Clock(), clk2 = Abc_Clock();
    p = Iso_ManCreate( pAig );
    p->timeFout += Abc_Clock() - clk;
    Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
    while ( p->nClasses )
    {
        // assign adjacency to classes
        clk = Abc_Clock();
        Iso_ManAssignAdjacency( p );
        p->timeFout += Abc_Clock() - clk;
        // rehash the class nodes
        clk = Abc_Clock();
        Iso_ManRehashClassNodes( p );
        p->timeHash += Abc_Clock() - clk;
        Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
        // force refinement
        while ( p->nSingles == 0 && p->nClasses )
        {
//            Iso_ManPrintClasseSizes( p );
            // assign IDs to the topmost level of classes
            Iso_ManBreakTies( p, fVerbose );
            // assign adjacency to classes
            clk = Abc_Clock();
            Iso_ManAssignAdjacency( p );
            p->timeFout += Abc_Clock() - clk;
            // rehash the class nodes
            clk = Abc_Clock();
            Iso_ManRehashClassNodes( p );
            p->timeHash += Abc_Clock() - clk;
            Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
        }
    }
    p->timeTotal = Abc_Clock() - clk2;
//    printf( "IDs assigned = %d.  Objects = %d.\n", p->nObjIds, 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig) );
    assert( p->nObjIds == 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig) );
//    if ( p->nClasses )
//        Iso_ManDumpOneClass( p );
    vRes = Iso_ManFinalize( p );
    Iso_ManStop( p, fVerbose );
    return vRes;
}